

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.c
# Opt level: O1

void BrotliWriteHuffmanTree
               (uint8_t *depth,size_t length,size_t *tree_size,uint8_t *tree,
               uint8_t *extra_bits_data)

{
  size_t sVar1;
  ulong uVar2;
  uint8_t uVar3;
  size_t new_length;
  long lVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint8_t uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  
  sVar1 = length;
  if (length != 0) {
    do {
      if (depth[sVar1 - 1] != '\0') goto LAB_001335b8;
      sVar1 = sVar1 - 1;
    } while (sVar1 != 0);
    sVar1 = 0;
  }
LAB_001335b8:
  if (length < 0x33) {
    bVar13 = false;
    bVar5 = false;
  }
  else {
    if (sVar1 == 0) {
      uVar7 = 2;
      uVar9 = 0;
      uVar2 = 2;
      uVar8 = 0;
    }
    else {
      lVar4 = 1;
      uVar8 = 0;
      uVar2 = 0;
      lVar6 = 1;
      uVar9 = 0;
      do {
        uVar11 = 1;
        uVar7 = uVar11;
        if (uVar2 + 1 < sVar1) {
          do {
            uVar7 = uVar11;
            if (depth[uVar11 + uVar2] != depth[uVar2]) break;
            uVar11 = uVar11 + 1;
            uVar7 = sVar1 - uVar2;
          } while (sVar1 - uVar2 != uVar11);
        }
        bVar13 = depth[uVar2] == '\0';
        lVar6 = lVar6 + (ulong)(bVar13 && 2 < uVar7);
        uVar11 = 0;
        if (bVar13 && 2 < uVar7) {
          uVar11 = uVar7;
        }
        uVar8 = uVar8 + uVar11;
        uVar11 = 0;
        if (3 < uVar7 && !bVar13) {
          uVar11 = uVar7;
        }
        uVar9 = uVar9 + uVar11;
        lVar4 = lVar4 + (ulong)(3 < uVar7 && !bVar13);
        uVar2 = uVar2 + uVar7;
      } while (uVar2 < sVar1);
      uVar2 = lVar4 * 2;
      uVar7 = lVar6 * 2;
    }
    bVar13 = uVar2 < uVar9;
    bVar5 = uVar7 < uVar8;
  }
  if (sVar1 != 0) {
    uVar2 = 0;
    uVar10 = '\b';
    do {
      uVar3 = depth[uVar2];
      uVar8 = 1;
      uVar7 = uVar8;
      if ((bool)(uVar2 + 1 < sVar1 & (uVar3 == '\0' & bVar5 | uVar3 != '\0' & bVar13))) {
        do {
          uVar7 = uVar8;
          if (depth[uVar8 + uVar2] != uVar3) break;
          uVar8 = uVar8 + 1;
          uVar7 = sVar1 - uVar2;
        } while (sVar1 - uVar2 != uVar8);
      }
      if (uVar3 == '\0') {
        uVar8 = uVar7;
        if (uVar7 == 0xb) {
          tree[*tree_size] = '\0';
          extra_bits_data[*tree_size] = '\0';
          *tree_size = *tree_size + 1;
          uVar8 = 10;
        }
        uVar3 = uVar10;
        if (uVar8 < 3) {
          for (; uVar8 != 0; uVar8 = uVar8 - 1) {
            tree[*tree_size] = '\0';
            extra_bits_data[*tree_size] = '\0';
            *tree_size = *tree_size + 1;
          }
        }
        else {
          uVar9 = *tree_size;
          uVar8 = uVar8 - 3;
          tree[uVar9] = '\x11';
          extra_bits_data[*tree_size] = (byte)uVar8 & 7;
          uVar11 = *tree_size;
          *tree_size = uVar11 + 1;
          while (7 < uVar8) {
            uVar8 = (uVar8 >> 3) - 1;
            tree[*tree_size] = '\x11';
            extra_bits_data[*tree_size] = (byte)uVar8 & 7;
            uVar11 = *tree_size;
            *tree_size = uVar11 + 1;
          }
          uVar8 = uVar9;
          if (uVar9 < uVar11) {
            do {
              uVar12 = uVar8 + 1;
              uVar10 = tree[uVar8];
              tree[uVar8] = tree[uVar11];
              tree[uVar11] = uVar10;
              uVar11 = uVar11 - 1;
              uVar8 = uVar12;
            } while (uVar12 < uVar11);
          }
          uVar8 = *tree_size - 1;
          if (uVar9 < uVar8) {
            do {
              uVar11 = uVar9 + 1;
              uVar10 = extra_bits_data[uVar9];
              extra_bits_data[uVar9] = extra_bits_data[uVar8];
              extra_bits_data[uVar8] = uVar10;
              uVar8 = uVar8 - 1;
              uVar9 = uVar11;
            } while (uVar11 < uVar8);
          }
        }
      }
      else {
        uVar8 = uVar7;
        if (uVar10 != uVar3) {
          tree[*tree_size] = uVar3;
          extra_bits_data[*tree_size] = '\0';
          *tree_size = *tree_size + 1;
          uVar8 = uVar7 - 1;
        }
        if (uVar8 == 7) {
          tree[*tree_size] = uVar3;
          extra_bits_data[*tree_size] = '\0';
          *tree_size = *tree_size + 1;
          uVar8 = 6;
        }
        if (uVar8 < 3) {
          for (; uVar8 != 0; uVar8 = uVar8 - 1) {
            tree[*tree_size] = uVar3;
            extra_bits_data[*tree_size] = '\0';
            *tree_size = *tree_size + 1;
          }
        }
        else {
          uVar9 = *tree_size;
          uVar8 = uVar8 - 3;
          tree[uVar9] = '\x10';
          extra_bits_data[*tree_size] = (byte)uVar8 & 3;
          uVar11 = *tree_size;
          *tree_size = uVar11 + 1;
          while (3 < uVar8) {
            uVar8 = (uVar8 >> 2) - 1;
            tree[*tree_size] = '\x10';
            extra_bits_data[*tree_size] = (byte)uVar8 & 3;
            uVar11 = *tree_size;
            *tree_size = uVar11 + 1;
          }
          uVar8 = uVar9;
          if (uVar9 < uVar11) {
            do {
              uVar12 = uVar8 + 1;
              uVar10 = tree[uVar8];
              tree[uVar8] = tree[uVar11];
              tree[uVar11] = uVar10;
              uVar11 = uVar11 - 1;
              uVar8 = uVar12;
            } while (uVar12 < uVar11);
          }
          uVar8 = *tree_size - 1;
          if (uVar9 < uVar8) {
            do {
              uVar11 = uVar9 + 1;
              uVar10 = extra_bits_data[uVar9];
              extra_bits_data[uVar9] = extra_bits_data[uVar8];
              extra_bits_data[uVar8] = uVar10;
              uVar8 = uVar8 - 1;
              uVar9 = uVar11;
            } while (uVar11 < uVar8);
          }
        }
      }
      uVar2 = uVar2 + uVar7;
      uVar10 = uVar3;
    } while (uVar2 < sVar1);
  }
  return;
}

Assistant:

void BrotliWriteHuffmanTree(const uint8_t* depth,
                            size_t length,
                            size_t* tree_size,
                            uint8_t* tree,
                            uint8_t* extra_bits_data) {
  uint8_t previous_value = BROTLI_INITIAL_REPEATED_CODE_LENGTH;
  size_t i;
  BROTLI_BOOL use_rle_for_non_zero = BROTLI_FALSE;
  BROTLI_BOOL use_rle_for_zero = BROTLI_FALSE;

  /* Throw away trailing zeros. */
  size_t new_length = length;
  for (i = 0; i < length; ++i) {
    if (depth[length - i - 1] == 0) {
      --new_length;
    } else {
      break;
    }
  }

  /* First gather statistics on if it is a good idea to do RLE. */
  if (length > 50) {
    /* Find RLE coding for longer codes.
       Shorter codes seem not to benefit from RLE. */
    DecideOverRleUse(depth, new_length,
                     &use_rle_for_non_zero, &use_rle_for_zero);
  }

  /* Actual RLE coding. */
  for (i = 0; i < new_length;) {
    const uint8_t value = depth[i];
    size_t reps = 1;
    if ((value != 0 && use_rle_for_non_zero) ||
        (value == 0 && use_rle_for_zero)) {
      size_t k;
      for (k = i + 1; k < new_length && depth[k] == value; ++k) {
        ++reps;
      }
    }
    if (value == 0) {
      BrotliWriteHuffmanTreeRepetitionsZeros(
          reps, tree_size, tree, extra_bits_data);
    } else {
      BrotliWriteHuffmanTreeRepetitions(previous_value,
                                        value, reps, tree_size,
                                        tree, extra_bits_data);
      previous_value = value;
    }
    i += reps;
  }
}